

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

void Dtt_ManRenum(int nVars,uint *pTable,int *pnClasses)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = 0;
  uVar4 = 0;
  do {
    uVar1 = (uint)uVar2;
    if (uVar1 >> (~(byte)(-1 << ((byte)nVars & 0x1f)) & 0x1f) != 0) {
      printf("The total number of NPN classes = %d.\n",(ulong)uVar4);
      *pnClasses = uVar4;
      return;
    }
    uVar3 = pTable[uVar2];
    if (uVar1 == uVar3) {
      uVar3 = uVar4;
      uVar4 = uVar4 + 1;
    }
    else {
      if (uVar1 <= uVar3) {
        __assert_fail("pTable[i] < i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn2.c"
                      ,0x153,"void Dtt_ManRenum(int, unsigned int *, int *)");
      }
      uVar3 = pTable[uVar3];
    }
    pTable[uVar2] = uVar3;
    uVar2 = (ulong)(uVar1 + 1);
  } while( true );
}

Assistant:

void Dtt_ManRenum( int nVars, unsigned * pTable, int * pnClasses )
{
    unsigned i, Limit = 1 << ((1 << nVars)-1), Count = 0;
    for ( i = 0; i < Limit; i++ )
        if ( pTable[i] == i )
            pTable[i] = Count++;
        else 
        {
            assert( pTable[i] < i );
            pTable[i] = pTable[pTable[i]];
        }
    printf( "The total number of NPN classes = %d.\n", Count );
    *pnClasses = Count;
}